

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint id;
  Variant *pVVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  ulong uVar6;
  SPIRAccessChain *pSVar7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char *pcVar10;
  undefined1 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  BaseType expr_type;
  char *atomic_op;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string value_expr;
  uint32_t result_type;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  atomic_op = (char *)0x0;
  value_expr._M_dataplus._M_p = (pointer)&value_expr.field_2;
  value_expr._M_string_length = 0;
  value_expr.field_2._M_local_buf[0] = '\0';
  uVar6 = (ulong)(op - OpAtomicLoad);
  switch(uVar6) {
  case 0:
switchD_00220f0a_caseD_0:
    pcVar10 = "0";
    break;
  case 1:
switchD_00220f0a_caseD_1:
    atomic_op = "InterlockedExchange";
    pSVar4 = Compiler::expression_type((Compiler *)this,*ops);
    uVar6 = (ulong)*ops;
    if ((uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar6].type == TypeAccessChain))
    {
      pSVar7 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar6);
    }
    else {
      pSVar7 = (SPIRAccessChain *)0x0;
    }
    pmVar8 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).extra_sub_expressions,ops);
    if (*pmVar8 == 0) {
      uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar8 = uVar3;
      pSVar5 = Compiler::get_pointee_type((Compiler *)this,pSVar4);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,(pSVar5->super_IVariant).self.id,*pmVar8);
    }
    if ((pSVar7 == (SPIRAccessChain *)0x0) || (pSVar4->storage == StorageClassImage)) {
      CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,*ops,true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)&result_type,&this->super_CompilerGLSL,*pmVar8,true);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x2f8011,&expr,
                 (char (*) [3])0x2f4768,&local_90,(char (*) [3])0x2f4768,(string *)&result_type,
                 (char (*) [3])0x2ddbdd);
      if ((undefined1 *)CONCAT44(uStack_4c,result_type) != local_40) {
        operator_delete((undefined1 *)CONCAT44(uStack_4c,result_type));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p == &expr.field_2) goto LAB_00221250;
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,*pmVar8,true);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&pSVar7->base,(char (*) [2])0x2e3c12,&atomic_op,
                 (char (*) [2])0x2f8011,&pSVar7->dynamic_index,&pSVar7->static_index,
                 (char (*) [3])0x2f4768,&expr,(char (*) [3])0x2f4768,&local_90,
                 (char (*) [3])0x2ddbdd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p == &expr.field_2) goto LAB_00221250;
    }
    goto LAB_0022124b;
  default:
    CompilerGLSL::to_expression_abi_cxx11_
              (&expr,&this->super_CompilerGLSL,ops[(ulong)(op == OpAtomicCompareExchange) + 5],true)
    ;
    ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
    paVar1 = &expr.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != paVar1) {
      operator_delete(expr._M_dataplus._M_p);
    }
    if (0xf < op - OpAtomicLoad) {
switchD_00220f87_caseD_4:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      expr._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&expr,"Unknown atomic opcode.","")
      ;
      ::std::runtime_error::runtime_error(prVar9,(string *)&expr);
      *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&switchD_00220f87::switchdataD_002e4d78 +
           (long)(int)(&switchD_00220f87::switchdataD_002e4d78)[uVar6]);
    switch(uVar6) {
    case 0:
      goto switchD_00220f0a_caseD_0;
    case 1:
      goto switchD_00220f0a_caseD_1;
    case 2:
      atomic_op = "InterlockedExchange";
      break;
    case 3:
      if (length < 8) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        expr._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&expr,"Not enough data for opcode.","");
        ::std::runtime_error::runtime_error(prVar9,(string *)&expr);
        *(undefined ***)prVar9 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      atomic_op = "InterlockedCompareExchange";
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[7],true);
      join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                (&expr,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4768,
                 (char (*) [3])&value_expr,in_R8);
      ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p != paVar1) {
        operator_delete(expr._M_dataplus._M_p);
      }
      puVar11 = (undefined1 *)
                CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 != &local_90.field_2) {
LAB_0022158a:
        operator_delete(puVar11);
      }
      break;
    case 4:
      goto switchD_00220f87_caseD_4;
    case 5:
      goto switchD_00220f0a_caseD_5;
    case 6:
      goto switchD_00220f0a_caseD_6;
    case 7:
      atomic_op = "InterlockedAdd";
      break;
    case 8:
      atomic_op = "InterlockedAdd";
      CompilerGLSL::enclose_expression(&local_90,&this->super_CompilerGLSL,&value_expr);
      join<char_const(&)[2],std::__cxx11::string>
                (&expr,(spirv_cross *)0x2e2fe1,(char (*) [2])&local_90,ts_1);
      ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p != paVar1) {
        operator_delete(expr._M_dataplus._M_p);
      }
      puVar11 = (undefined1 *)
                CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11 != &local_90.field_2) goto LAB_0022158a;
      break;
    default:
      atomic_op = "InterlockedMin";
      break;
    case 0xb:
    case 0xc:
      atomic_op = "InterlockedMax";
      break;
    case 0xd:
      atomic_op = "InterlockedAnd";
      break;
    case 0xe:
      atomic_op = "InterlockedOr";
      break;
    case 0xf:
      atomic_op = "InterlockedXor";
    }
    goto LAB_00220fd7;
  case 5:
switchD_00220f0a_caseD_5:
    pcVar10 = "1";
    break;
  case 6:
switchD_00220f0a_caseD_6:
    pcVar10 = "-1";
  }
  atomic_op = "InterlockedAdd";
  ::std::__cxx11::string::_M_replace
            ((ulong)&value_expr,0,(char *)value_expr._M_string_length,(ulong)pcVar10);
LAB_00220fd7:
  result_type = *ops;
  id = ops[1];
  expr._M_dataplus._M_p = (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)expr._M_dataplus._M_p,ops + 1);
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + result_type);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&expr,this,pSVar4,&local_90,0);
  CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,&expr,(char (*) [2])0x2ddbde);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  pSVar5 = Compiler::expression_type((Compiler *)this,ops[2]);
  uVar6 = (ulong)ops[2];
  if ((uVar6 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar6].type == TypeAccessChain)) {
    pSVar7 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar6);
  }
  else {
    pSVar7 = (SPIRAccessChain *)0x0;
  }
  if ((pSVar7 == (SPIRAccessChain *)0x0) || (pSVar5->storage == StorageClassImage)) {
    CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,ops[2],true);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
    CompilerGLSL::
    statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x2f8011,&expr,
               (char (*) [3])0x2f4768,&value_expr,(char (*) [3])0x2f4768,&local_90,
               (char (*) [3])0x2ddbdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != &expr.field_2) {
      operator_delete(expr._M_dataplus._M_p);
    }
    expr_type = *(BaseType *)&(pSVar5->super_IVariant).field_0xc;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&expr,this,(ulong)id,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&pSVar7->base,(char (*) [2])0x2e3c12,&atomic_op,
               (char (*) [2])0x2f8011,&pSVar7->dynamic_index,&pSVar7->static_index,
               (char (*) [3])0x2f4768,&value_expr,(char (*) [3])0x2f4768,&expr,
               (char (*) [3])0x2ddbdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != &expr.field_2) {
      operator_delete(expr._M_dataplus._M_p);
    }
    expr_type = UInt;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  CompilerGLSL::bitcast_expression(&expr,&this->super_CompilerGLSL,pSVar4,expr_type,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  local_90._M_dataplus._M_p._0_1_ = 1;
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,id,&expr,&result_type,(bool *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
LAB_0022124b:
    operator_delete(expr._M_dataplus._M_p);
  }
LAB_00221250:
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value_expr._M_dataplus._M_p != &value_expr.field_2) {
    operator_delete(value_expr._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[0]), ", ", to_expression(ops[3]), ", ", to_expression(tmp_id),
			          ");");
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			expr_type = SPIRType::UInt;
			statement(chain->base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}